

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# feature_resolver_test.cc
# Opt level: O0

void __thiscall
google::protobuf::anon_unknown_0::FeatureResolverTest_DefaultsMergedFeatures_Test::
~FeatureResolverTest_DefaultsMergedFeatures_Test
          (FeatureResolverTest_DefaultsMergedFeatures_Test *this)

{
  FeatureResolverTest_DefaultsMergedFeatures_Test *this_local;
  
  ~FeatureResolverTest_DefaultsMergedFeatures_Test(this);
  operator_delete(this,0x10);
  return;
}

Assistant:

TEST(FeatureResolverTest, DefaultsMergedFeatures) {
  absl::StatusOr<FeatureSetDefaults> defaults =
      FeatureResolver::CompileDefaults(FeatureSet::descriptor(),
                                       {GetExtension(pb::test)}, EDITION_2023,
                                       EDITION_2023);
  ASSERT_OK(defaults);
  ASSERT_EQ(defaults->defaults_size(), 3);

  defaults->mutable_defaults(2)
      ->mutable_fixed_features()
      ->MutableExtension(pb::test)
      ->set_file_feature(pb::VALUE7);
  defaults->mutable_defaults(2)
      ->mutable_fixed_features()
      ->MutableExtension(pb::test)
      ->set_multiple_feature(pb::VALUE6);
  defaults->mutable_defaults(2)
      ->mutable_overridable_features()
      ->MutableExtension(pb::test)
      ->clear_file_feature();
  defaults->mutable_defaults(2)
      ->mutable_overridable_features()
      ->MutableExtension(pb::test)
      ->set_multiple_feature(pb::VALUE8);

  absl::StatusOr<FeatureSet> features = GetDefaults(EDITION_2023, *defaults);
  ASSERT_OK(features);

  const pb::TestFeatures& ext = features->GetExtension(pb::test);
  EXPECT_EQ(ext.file_feature(), pb::VALUE7);
  EXPECT_EQ(ext.multiple_feature(), pb::VALUE8);
}